

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# print.hpp
# Opt level: O3

void __thiscall
ptc::Print<char32_t>::
print_backend<std::__cxx11::basic_ostringstream<char32_t,std::char_traits<char32_t>,std::allocator<char32_t>>&,char_const(&)[8],char_const(&)[5]>
          (Print<char32_t> *this,
          basic_ostringstream<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> *os,
          char (*first) [8],char (*args) [5])

{
  size_type sVar1;
  char32_t *__s;
  int iVar2;
  basic_ostream<char32_t,_std::char_traits<char32_t>_> *pbVar3;
  undefined8 uVar4;
  
  iVar2 = pthread_mutex_lock((pthread_mutex_t *)mutex_);
  if (iVar2 == 0) {
    sVar1 = (this->pattern)._M_string_length;
    if (sVar1 == 0) {
      std::operator<<(&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,*first);
    }
    else {
      pbVar3 = std::__ostream_insert<char32_t,std::char_traits<char32_t>>
                         (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
                          (this->pattern)._M_dataplus._M_p,sVar1);
      pbVar3 = std::operator<<(pbVar3,*first);
      std::__ostream_insert<char32_t,std::char_traits<char32_t>>
                (pbVar3,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    }
    __s = (this->sep)._M_dataplus._M_p;
    sVar1 = (this->sep)._M_string_length;
    if ((this->pattern)._M_string_length == 0) {
      pbVar3 = std::__ostream_insert<char32_t,std::char_traits<char32_t>>
                         (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,__s,sVar1)
      ;
      std::operator<<(pbVar3,*args);
    }
    else {
      pbVar3 = std::__ostream_insert<char32_t,std::char_traits<char32_t>>
                         (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,__s,sVar1)
      ;
      pbVar3 = std::__ostream_insert<char32_t,std::char_traits<char32_t>>
                         (pbVar3,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
      pbVar3 = std::operator<<(pbVar3,*args);
      std::__ostream_insert<char32_t,std::char_traits<char32_t>>
                (pbVar3,(this->pattern)._M_dataplus._M_p,(this->pattern)._M_string_length);
    }
    std::__ostream_insert<char32_t,std::char_traits<char32_t>>
              (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>,
               (this->end)._M_dataplus._M_p,(this->end)._M_string_length);
    if (this->flush == true) {
      std::basic_ostream<char32_t,_std::char_traits<char32_t>_>::flush
                (&os->super_basic_ostream<char32_t,_std::char_traits<char32_t>_>);
    }
    pthread_mutex_unlock((pthread_mutex_t *)mutex_);
    return;
  }
  uVar4 = std::__throw_system_error(iVar2);
  pthread_mutex_unlock((pthread_mutex_t *)mutex_);
  _Unwind_Resume(uVar4);
}

Assistant:

void print_backend( T_os&& os, T&& first, Args&&... args ) const
     {
      std::lock_guard <std::mutex> lock{ mutex_ };

      // Printing the first argument
      if( is_escape( first, ANSI::first ) || pattern.empty() ) os << first;
      else os << pattern << first << pattern;
      
      // Printing all the other arguments
      if constexpr( sizeof...( args ) > 0 ) 
       {
        if ( is_escape( first, ANSI::first ) ) 
         {
          if( pattern.empty() ) ( ( os << args << sep ), ...);
          else ( ( os << pattern << args << pattern << sep ), ...);
         }
        else 
         {
          if( pattern.empty() ) ( ( os << sep << args ), ...);
          else ( ( os << sep << pattern << args << pattern ), ...);
         }
       }
      os << end;
      
      // Resetting the stream from ANSI escape sequences
      if constexpr( sizeof...( args ) > 0 )
       {
        if ( is_escape( first, ANSI::generic ) || ( ( is_escape( args, ANSI::generic ) ) || ...) )
         {
          os << "\033[0m";
         }
       }
      else 
       {
       if ( is_escape( first, ANSI::generic ) ) 
        {
         os << "\033[0m";
        }
       }

      // Other operations
      if ( flush ) os << std::flush;
     }